

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

Validity * __thiscall
kj::TestRunner::setFilter(Validity *__return_storage_ptr__,TestRunner *this,StringPtr pattern)

{
  long lVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  char *__nptr;
  uint uVar10;
  size_t sVar11;
  long *plVar12;
  ArrayPtr<const_char> pattern_00;
  StringPtr name;
  StringPtr pattern_local;
  GlobFilter filter;
  
  pattern_local.content.size_ = pattern.content.size_;
  pcVar8 = pattern.content.ptr;
  this->hasFilter = true;
  sVar11 = pattern_local.content.size_ - 1;
  pattern_local.content.ptr = pcVar8;
  StringPtr::findLast((StringPtr *)&filter,(char)&pattern_local);
  if ((char)filter.pattern.content.ptr == '\0') {
    uVar9 = 0;
    uVar10 = 0xffffffff;
    goto LAB_002fbc4d;
  }
  __nptr = pattern_local.content.ptr + filter.pattern.content.size_ + 1;
  uVar5 = strtoul(__nptr,(char **)&filter,0);
  pcVar2 = (char *)CONCAT71(filter.pattern.content.ptr._1_7_,(char)filter.pattern.content.ptr);
  uVar10 = 0xffffffff;
  if (pcVar2 == __nptr) {
LAB_002fbc48:
    uVar9 = 0;
  }
  else {
    uVar3 = (uint)uVar5;
    if (*pcVar2 != '\0') {
      uVar9 = 0;
      if (*pcVar2 != '-') goto LAB_002fbc4d;
      uVar6 = strtoul(pcVar2 + 1,(char **)&filter,0);
      if ((char *)CONCAT71(filter.pattern.content.ptr._1_7_,(char)filter.pattern.content.ptr) <=
          pcVar2 + 1) goto LAB_002fbc48;
      uVar9 = 0;
      uVar3 = (uint)uVar6;
      if (*(char *)CONCAT71(filter.pattern.content.ptr._1_7_,(char)filter.pattern.content.ptr) !=
          '\0') goto LAB_002fbc4d;
    }
    uVar10 = uVar3;
    pcVar8 = pattern_local.content.ptr;
    sVar11 = filter.pattern.content.size_;
    uVar9 = (uint)uVar5;
  }
LAB_002fbc4d:
  pattern_00.size_ = sVar11;
  pattern_00.ptr = pcVar8;
  _::GlobFilter::GlobFilter(&filter,pattern_00);
  plVar12 = &(anonymous_namespace)::testCasesHead;
  while (lVar1 = *plVar12, lVar1 != 0) {
    if (*(char *)(lVar1 + 0x30) == '\0') {
      pcVar8 = *(char **)(lVar1 + 8);
      sVar7 = strlen(pcVar8);
      name.content.size_ = sVar7 + 1;
      name.content.ptr = pcVar8;
      bVar4 = _::GlobFilter::matches(&filter,name);
      if (((bVar4) && (uVar9 <= *(uint *)(lVar1 + 0x10))) && (*(uint *)(lVar1 + 0x10) <= uVar10)) {
        *(undefined1 *)(lVar1 + 0x30) = 1;
      }
    }
    plVar12 = (long *)(lVar1 + 0x20);
  }
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  _::GlobFilter::~GlobFilter(&filter);
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setFilter(StringPtr pattern) {
    hasFilter = true;
    ArrayPtr<const char> filePattern = pattern;
    uint minLine = kj::minValue;
    uint maxLine = kj::maxValue;

    KJ_IF_MAYBE(colonPos, pattern.findLast(':')) {
      char* end;
      StringPtr lineStr = pattern.slice(*colonPos + 1);

      bool parsedRange = false;
      minLine = strtoul(lineStr.cStr(), &end, 0);
      if (end != lineStr.begin()) {
        if (*end == '-') {
          // A range.
          const char* part2 = end + 1;
          maxLine = strtoul(part2, &end, 0);
          if (end > part2 && *end == '\0') {
            parsedRange = true;
          }
        } else if (*end == '\0') {
          parsedRange = true;
          maxLine = minLine;
        }
      }

      if (parsedRange) {
        // We have an exact line number.
        filePattern = pattern.slice(0, *colonPos);
      } else {
        // Can't parse as a number. Maybe the colon is part of a Windows path name or something.
        // Let's just keep it as part of the file pattern.
        minLine = kj::minValue;
        maxLine = kj::maxValue;
      }
    }

    _::GlobFilter filter(filePattern);

    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!testCase->matchedFilter && filter.matches(testCase->file) &&
          testCase->line >= minLine && testCase->line <= maxLine) {
        testCase->matchedFilter = true;
      }
    }

    return true;
  }